

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GeneratePrivateMembers
          (StringFieldGenerator *this,Printer *printer)

{
  ulong uVar1;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,"::std::string* $name$_;\n");
  FieldDescriptor::default_value_string_abi_cxx11_(this->descriptor_);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    io::Printer::Print(printer,&this->variables_,"static ::std::string* $default_variable$;\n");
  }
  return;
}

Assistant:

void StringFieldGenerator::
GeneratePrivateMembers(io::Printer* printer) const {
  printer->Print(variables_, "::std::string* $name$_;\n");
  if (!descriptor_->default_value_string().empty()) {
    printer->Print(variables_, "static ::std::string* $default_variable$;\n");
  }
}